

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentType.cpp
# Opt level: O0

bool __thiscall DIS::EnvironmentType::operator==(EnvironmentType *this,EnvironmentType *rhs)

{
  bool local_19;
  bool ivarsEqual;
  EnvironmentType *rhs_local;
  EnvironmentType *this_local;
  
  local_19 = this->_domain == rhs->_domain && this->_entityKind == rhs->_entityKind;
  if (this->_entityClass != rhs->_entityClass) {
    local_19 = false;
  }
  if (this->_category != rhs->_category) {
    local_19 = false;
  }
  if (this->_subcategory != rhs->_subcategory) {
    local_19 = false;
  }
  if (this->_specific != rhs->_specific) {
    local_19 = false;
  }
  if (this->_extra != rhs->_extra) {
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool EnvironmentType::operator ==(const EnvironmentType& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_entityKind == rhs._entityKind) ) ivarsEqual = false;
     if( ! (_domain == rhs._domain) ) ivarsEqual = false;
     if( ! (_entityClass == rhs._entityClass) ) ivarsEqual = false;
     if( ! (_category == rhs._category) ) ivarsEqual = false;
     if( ! (_subcategory == rhs._subcategory) ) ivarsEqual = false;
     if( ! (_specific == rhs._specific) ) ivarsEqual = false;
     if( ! (_extra == rhs._extra) ) ivarsEqual = false;

    return ivarsEqual;
 }